

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pliocomp.c
# Opt level: O0

int pl_p2li(int *pxsrc,int xs,short *lldst,int npix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  short local_70;
  short local_6c;
  int local_68;
  int local_64;
  int nz;
  int pv;
  int nv;
  int iz;
  int op;
  int np;
  int xe;
  int dv;
  int ip;
  int hi;
  int x1;
  int v;
  int zero;
  int i__3;
  int i__2;
  int i__1;
  int ret_val;
  int npix_local;
  short *lldst_local;
  int xs_local;
  int *pxsrc_local;
  
  nv = 0;
  if (npix < 1) {
    ret_val = 0;
  }
  else {
    lldst[2] = -100;
    lldst[1] = 7;
    *lldst = 0;
    lldst[5] = 0;
    lldst[6] = 0;
    iVar1 = xs + npix + -1;
    op = 8;
    local_64 = pxsrc[(long)xs + -1];
    if (local_64 < 0) {
      local_64 = 0;
    }
    pv = local_64;
    hi = 1;
    iz = xs;
    x1 = xs;
    for (ip = xs; ip <= iVar1; ip = ip + 1) {
      if (ip < iVar1) {
        local_68 = pxsrc[(long)(ip + 1) + -1];
        if (local_68 < 0) {
          local_68 = 0;
        }
        nv = local_68;
        if (local_68 != pv) {
          iVar3 = x1;
          if (pv != 0) goto LAB_002048cd;
          pv = local_68;
          x1 = ip + 1;
        }
      }
      else {
        iVar3 = xs + npix;
        if (pv != 0) {
          iVar3 = x1;
        }
LAB_002048cd:
        x1 = iVar3;
        np = (ip - x1) + 1;
        nz = x1 - iz;
        iVar3 = op;
        if ((pv < 1) || (iVar2 = pv - hi, iVar2 == 0)) {
LAB_00204a1c:
          op = iVar3;
          if (0 < nz) {
            for (; 0 < nz; nz = nz + -0xfff) {
              if (nz < 0x1000) {
                local_6c = (short)nz;
              }
              else {
                local_6c = 0xfff;
              }
              lldst[(long)op + -1] = local_6c;
              op = op + 1;
            }
            if ((np == 1) && (0 < pv)) {
              lldst[(long)(op + -1) + -1] = lldst[(long)(op + -1) + -1] + 0x5001;
              goto LAB_00204b21;
            }
          }
          for (; 0 < np; np = np + -0xfff) {
            if (np < 0x1000) {
              local_70 = (short)np;
            }
            else {
              local_70 = 0xfff;
            }
            lldst[(long)op + -1] = local_70 + 0x4000;
            op = op + 1;
          }
        }
        else {
          hi = pv;
          iVar3 = iVar2;
          if (iVar2 < 1) {
            iVar3 = -iVar2;
          }
          if (0xfff < iVar3) {
            lldst[(long)op + -1] = ((ushort)pv & 0xfff) + 0x1000;
            lldst[(long)(op + 1) + -1] = (short)((long)pv / 0x1000);
            iVar3 = op + 2;
            goto LAB_00204a1c;
          }
          if (iVar2 < 0) {
            lldst[(long)op + -1] = 0x3000 - (short)iVar2;
          }
          else {
            lldst[(long)op + -1] = (short)iVar2 + 0x2000;
          }
          iVar3 = op + 1;
          if ((np != 1) || (nz != 0)) goto LAB_00204a1c;
          lldst[(long)op + -1] = lldst[(long)op + -1] | 0x4000;
          op = iVar3;
        }
LAB_00204b21:
        iz = ip + 1;
        pv = nv;
        x1 = iz;
      }
    }
    lldst[3] = (short)((op + -1) % 0x8000);
    lldst[4] = (short)((long)(op + -1) / 0x8000);
    ret_val = op + -1;
  }
  return ret_val;
}

Assistant:

int pl_p2li (int *pxsrc, int xs, short *lldst, int npix)
/* int *pxsrc;                      input pixel array */
/* int xs;                          starting index in pxsrc (?) */
/* short *lldst;                    encoded line list */
/* int npix;                        number of pixels to convert */
{
    /* System generated locals */
    int ret_val, i__1, i__2, i__3;

    /* Local variables */
    int zero, v, x1, hi, ip, dv, xe, np, op, iz, nv = 0, pv, nz;

    /* Parameter adjustments */
    --lldst;
    --pxsrc;

    /* Function Body */
    if (! (npix <= 0)) {
        goto L110;
    }
    ret_val = 0;
    goto L100;
L110:
    lldst[3] = -100;
    lldst[2] = 7;
    lldst[1] = 0;
    lldst[6] = 0;
    lldst[7] = 0;
    xe = xs + npix - 1;
    op = 8;
    zero = 0;
/* Computing MAX */
    i__1 = zero, i__2 = pxsrc[xs];
    pv = max(i__1,i__2);
    x1 = xs;
    iz = xs;
    hi = 1;
    i__1 = xe;
    for (ip = xs; ip <= i__1; ++ip) {
        if (! (ip < xe)) {
            goto L130;
        }
/* Computing MAX */
        i__2 = zero, i__3 = pxsrc[ip + 1];
        nv = max(i__2,i__3);
        if (! (nv == pv)) {
            goto L140;
        }
        goto L120;
L140:
        if (! (pv == 0)) {
            goto L150;
        }
        pv = nv;
        x1 = ip + 1;
        goto L120;
L150:
        goto L131;
L130:
        if (! (pv == 0)) {
            goto L160;
        }
        x1 = xe + 1;
L160:
L131:
        np = ip - x1 + 1;
        nz = x1 - iz;
        if (! (pv > 0)) {
            goto L170;
        }
        dv = pv - hi;
        if (! (dv != 0)) {
            goto L180;
        }
        hi = pv;
        if (! (abs(dv) > 4095)) {
            goto L190;
        }
        lldst[op] = (short) ((pv & 4095) + 4096);
        ++op;
        lldst[op] = (short) (pv / 4096);
        ++op;
        goto L191;
L190:
        if (! (dv < 0)) {
            goto L200;
        }
        lldst[op] = (short) (-dv + 12288);
        goto L201;
L200:
        lldst[op] = (short) (dv + 8192);
L201:
        ++op;
        if (! (np == 1 && nz == 0)) {
            goto L210;
        }
        v = lldst[op - 1];
        lldst[op - 1] = (short) (v | 16384);
        goto L91;
L210:
L191:
L180:
L170:
        if (! (nz > 0)) {
            goto L220;
        }
L230:
        if (! (nz > 0)) {
            goto L232;
        }
        lldst[op] = (short) min(4095,nz);
        ++op;
/* L231: */
        nz += -4095;
        goto L230;
L232:
        if (! (np == 1 && pv > 0)) {
            goto L240;
        }
        lldst[op - 1] = (short) (lldst[op - 1] + 20481);
        goto L91;
L240:
L220:
L250:
        if (! (np > 0)) {
            goto L252;
        }
        lldst[op] = (short) (min(4095,np) + 16384);
        ++op;
/* L251: */
        np += -4095;
        goto L250;
L252:
L91:
        x1 = ip + 1;
        iz = x1;
        pv = nv;
L120:
        ;
    }
/* L121: */
    lldst[4] = (short) ((op - 1) % 32768);
    lldst[5] = (short) ((op - 1) / 32768);
    ret_val = op - 1;
    goto L100;
L100:
    return ret_val;
}